

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O0

int h264_residual_luma(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                      h264_macroblock *mb,int start,int end,int which)

{
  int iVar1;
  int maxnumcoeff;
  int iVar2;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int32_t local_a8;
  int cat;
  int32_t tmp [16];
  int se;
  int ss;
  int n;
  int j;
  int i;
  int end_local;
  int start_local;
  h264_macroblock *mb_local;
  h264_slice *slice_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  if ((start == 0) && (iVar1 = h264_is_intra_16x16_mb_type(mb->mb_type), iVar1 != 0)) {
    iVar1 = h264_residual_block(str,cabac,slice,mb,mb->block_luma_dc[which],(int *)0x0,
                                h264_residual_luma::cattab[which][0],0,0,0xf,0x10,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    mb->coded_block_flag[which][0x10] = 0;
  }
  iVar1 = h264_is_intra_16x16_mb_type(mb->mb_type);
  maxnumcoeff = 0x10;
  if (iVar1 != 0) {
    maxnumcoeff = 0xf;
  }
  iVar1 = h264_is_intra_16x16_mb_type(mb->mb_type);
  local_b4 = start;
  if (iVar1 != 0) {
    if (start == 0) {
      local_b0 = 0;
    }
    else {
      local_b0 = start + -1;
    }
    local_b4 = local_b0;
  }
  iVar1 = h264_is_intra_16x16_mb_type(mb->mb_type);
  local_b8 = end;
  if (iVar1 != 0) {
    local_b8 = end + -1;
  }
  tmp[0xf] = local_b8;
  if ((mb->transform_size_8x8_flag == 0) || (cabac == (h264_cabac_context *)0x0)) {
    for (n = 0; n < 0x10; n = n + 1) {
      iVar1 = n >> 2;
      if (mb->transform_size_8x8_flag == 0) {
        iVar2 = h264_is_intra_16x16_mb_type(mb->mb_type);
        if (iVar2 == 0) {
          for (ss = 0; ss < 0x10; ss = ss + 1) {
            (&local_a8)[ss] = mb->block_luma_4x4[which][n][ss];
          }
          local_ac = h264_residual_luma::cattab[which][2];
        }
        else {
          for (ss = 0; ss < 0xf; ss = ss + 1) {
            (&local_a8)[ss] = mb->block_luma_ac[which][n][ss];
          }
          local_ac = h264_residual_luma::cattab[which][1];
        }
      }
      else {
        for (ss = 0; ss < 0x10; ss = ss + 1) {
          (&local_a8)[ss] = mb->block_luma_8x8[which][iVar1][(int)(ss * 4 + (n & 3U))];
        }
        local_ac = h264_residual_luma::cattab[which][3];
      }
      iVar2 = h264_residual_block(str,cabac,slice,mb,&local_a8,mb->total_coeff[which] + n,local_ac,n
                                  ,local_b4,tmp[0xf],maxnumcoeff,
                                  mb->coded_block_pattern >> ((byte)iVar1 & 0x1f) & 1);
      if (iVar2 != 0) {
        return 1;
      }
      if (mb->transform_size_8x8_flag == 0) {
        iVar1 = h264_is_intra_16x16_mb_type(mb->mb_type);
        if (iVar1 == 0) {
          for (ss = 0; ss < 0x10; ss = ss + 1) {
            mb->block_luma_4x4[which][n][ss] = (&local_a8)[ss];
          }
        }
        else {
          for (ss = 0; ss < 0xf; ss = ss + 1) {
            mb->block_luma_ac[which][n][ss] = (&local_a8)[ss];
          }
        }
      }
      else {
        for (ss = 0; ss < 0x10; ss = ss + 1) {
          mb->block_luma_8x8[which][iVar1][(int)(ss * 4 + (n & 3U))] = (&local_a8)[ss];
        }
      }
    }
  }
  else {
    for (n = 0; n < 4; n = n + 1) {
      iVar1 = h264_residual_block(str,cabac,slice,mb,mb->block_luma_8x8[which][n],(int *)0x0,
                                  h264_residual_luma::cattab[which][3],n,start << 2,end * 4 + 3,0x40
                                  ,mb->coded_block_pattern >> ((byte)n & 0x1f) & 1);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int h264_residual_luma(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int start, int end, int which) {
	static const int cattab[3][4] = {
		{ H264_CTXBLOCKCAT_LUMA_DC, H264_CTXBLOCKCAT_LUMA_AC, H264_CTXBLOCKCAT_LUMA_4X4, H264_CTXBLOCKCAT_LUMA_8X8 }, 
		{ H264_CTXBLOCKCAT_CB_DC, H264_CTXBLOCKCAT_CB_AC, H264_CTXBLOCKCAT_CB_4X4, H264_CTXBLOCKCAT_CB_8X8 }, 
		{ H264_CTXBLOCKCAT_CR_DC, H264_CTXBLOCKCAT_CR_AC, H264_CTXBLOCKCAT_CR_4X4, H264_CTXBLOCKCAT_CR_8X8 }, 
	};
	if (start == 0 && h264_is_intra_16x16_mb_type(mb->mb_type)) {
		if (h264_residual_block(str, cabac, slice, mb, mb->block_luma_dc[which], 0, cattab[which][0], 0, 0, 15, 16, 1)) return 1;
	} else {
		mb->coded_block_flag[which][16] = 0;
	}
	int i, j;
	int n = (h264_is_intra_16x16_mb_type(mb->mb_type) ? 15 : 16);
	int ss = (h264_is_intra_16x16_mb_type(mb->mb_type) ? (start?start-1:0) : start);
	int se = (h264_is_intra_16x16_mb_type(mb->mb_type) ? end - 1 : end);
	if (!mb->transform_size_8x8_flag || !cabac) {
		for (i = 0; i < 16; i++) {
			int32_t tmp[16];
			int cat;
			if (mb->transform_size_8x8_flag) {
				for (j = 0; j < 16; j++)
					tmp[j] = mb->block_luma_8x8[which][i >> 2][4 * j + (i & 3)];
				cat = cattab[which][3];
			} else if (h264_is_intra_16x16_mb_type(mb->mb_type)) {
				for (j = 0; j < 15; j++)
					tmp[j] = mb->block_luma_ac[which][i][j];
				cat = cattab[which][1];
			} else {
				for (j = 0; j < 16; j++)
					tmp[j] = mb->block_luma_4x4[which][i][j];
				cat = cattab[which][2];
			}
			if (h264_residual_block(str, cabac, slice, mb, tmp, &mb->total_coeff[which][i], cat, i, ss, se, n, mb->coded_block_pattern >> (i >> 2) & 1)) return 1;
			if (mb->transform_size_8x8_flag) {
				for (j = 0; j < 16; j++)
					mb->block_luma_8x8[which][i >> 2][4 * j + (i & 3)] = tmp[j];
			} else if (h264_is_intra_16x16_mb_type(mb->mb_type)) {
				for (j = 0; j < 15; j++)
					mb->block_luma_ac[which][i][j] = tmp[j];
			} else {
				for (j = 0; j < 16; j++)
					mb->block_luma_4x4[which][i][j] = tmp[j];
			}
		}
	} else {
		for (i = 0; i < 4; i++) {
			if (h264_residual_block(str, cabac, slice, mb, mb->block_luma_8x8[which][i], 0, cattab[which][3], i, 4*start, 4*end + 3, 64, mb->coded_block_pattern >> i & 1)) return 1;
		}
	}
	return 0;
}